

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O1

void print_level(v_array<v_array<unsigned_int>_> level)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long in_stack_00000008;
  long in_stack_00000010;
  
  if (in_stack_00000010 - in_stack_00000008 != 0) {
    lVar1 = in_stack_00000010 - in_stack_00000008 >> 5;
    lVar4 = 0;
    do {
      lVar2 = lVar4 * 0x20;
      if (*(long *)(in_stack_00000008 + 8 + lVar2) != *(long *)(in_stack_00000008 + lVar2)) {
        uVar3 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          uVar3 = uVar3 + 1;
        } while (uVar3 < (ulong)(((long *)(lVar2 + in_stack_00000008))[1] -
                                 *(long *)(lVar2 + in_stack_00000008) >> 2));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," | ",3);
      lVar4 = lVar4 + 1;
    } while (lVar4 != lVar1 + (ulong)(lVar1 == 0));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  return;
}

Assistant:

void print_level(v_array<v_array<uint32_t>> level)
{
  for (size_t t = 0; t < level.size(); t++)
  {
    for (size_t i = 0; i < level[t].size(); i++) cout << " " << level[t][i];
    cout << " | ";
  }
  cout << endl;
}